

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O2

void __thiscall
ODDLParser::OpenDDLParserTest_clearTest_Test::~OpenDDLParserTest_clearTest_Test
          (OpenDDLParserTest_clearTest_Test *this)

{
  OpenDDLParserTest::~OpenDDLParserTest(&this->super_OpenDDLParserTest);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, clearTest) {
    OpenDDLParser myParser;
    EXPECT_EQ(nullptr, myParser.getRoot());

    myParser.clear();

    char token[] =
            "GeometryNode $node1\n"
            "{\n"
            "    string\n"
            "    {\n"
            "        \"test\"\n"
            "    }\n"
            "}";

    myParser.setBuffer(token, strlen(token));
    myParser.parse();
    EXPECT_TRUE(nullptr != myParser.getRoot());

    myParser.clear();
    EXPECT_EQ(nullptr, myParser.getRoot());
}